

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

_Bool rf_check_collision_point_rec(rf_vec2 point,rf_rec rec)

{
  byte bVar1;
  
  bVar1 = 0;
  if ((rec.x <= point.x) && (bVar1 = 0, point.x <= rec.x + rec.width)) {
    bVar1 = -(point.y <= rec.height + rec.y) & -(rec.y <= point.y);
  }
  return (_Bool)(bVar1 & 1);
}

Assistant:

bool rf_check_collision_point_rec(rf_vec2 point, rf_rec rec)
{
    bool collision = 0;

    if ((point.x >= rec.x) && (point.x <= (rec.x + rec.width)) && (point.y >= rec.y) &&
        (point.y <= (rec.y + rec.height)))
        collision = 1;

    return collision;
}